

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

Fl_Window * fl_find(Window xid)

{
  Fl_X *pFVar1;
  Fl_X **ppFVar2;
  
  ppFVar2 = &Fl_X::first;
  while( true ) {
    pFVar1 = *ppFVar2;
    if (pFVar1 == (Fl_X *)0x0) {
      return (Fl_Window *)0x0;
    }
    if (pFVar1->xid == xid) break;
    ppFVar2 = &pFVar1->next;
  }
  if ((pFVar1 != Fl_X::first) && (Fl::modal_ == (Fl_Window *)0x0)) {
    *ppFVar2 = pFVar1->next;
    pFVar1->next = Fl_X::first;
    Fl_X::first = pFVar1;
  }
  return pFVar1->w;
}

Assistant:

Fl_Window* fl_find(Window xid) {
  Fl_X *window;
  for (Fl_X **pp = &Fl_X::first; (window = *pp); pp = &window->next)
   if (window->xid == xid) {
      if (window != Fl_X::first && !Fl::modal()) {
        // make this window be first to speed up searches
        // this is not done if modal is true to avoid messing up modal stack
        *pp = window->next;
        window->next = Fl_X::first;
        Fl_X::first = window;
      }
      return window->w;
    }
  return 0;
}